

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

CScaledGlyph * allocator_default<CScaledGlyph>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  CScaledGlyph *pCVar4;
  int in_EDI;
  CScaledGlyph *this;
  CScaledGlyph *local_38;
  
  uVar2 = (ulong)in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x40),0);
  if (SUB168(auVar1 * ZEXT816(0x40),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pCVar4 = (CScaledGlyph *)operator_new__(uVar3);
  if (uVar2 != 0) {
    this = pCVar4 + uVar2;
    local_38 = pCVar4;
    do {
      CScaledGlyph::CScaledGlyph(this);
      local_38 = local_38 + 1;
    } while (local_38 != this);
  }
  return pCVar4;
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }